

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O2

void __thiscall xs::PosixTestProcess::~PosixTestProcess(PosixTestProcess *this)

{
  Process *this_00;
  
  (this->super_TestProcess)._vptr_TestProcess = (_func_int **)&PTR__PosixTestProcess_0012c658;
  this_00 = this->m_process;
  if (this_00 != (Process *)0x0) {
    de::Process::~Process(this_00);
  }
  operator_delete(this_00,8);
  posix::FileReader::~FileReader(&this->m_logReader);
  de::Thread::~Thread(&(this->m_stdErrReader).super_Thread);
  de::Thread::~Thread(&(this->m_stdOutReader).super_Thread);
  posix::CaseListWriter::~CaseListWriter(&this->m_caseListWriter);
  de::BlockBuffer<unsigned_char>::~BlockBuffer(&this->m_infoBuffer);
  std::__cxx11::string::~string((string *)&this->m_logFileName);
  return;
}

Assistant:

PosixTestProcess::~PosixTestProcess (void)
{
	delete m_process;
}